

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_auto_possess.c
# Opt level: O0

PCRE2_SPTR16 get_chr_property_list(PCRE2_SPTR16 code,BOOL utf,uint8_t *fcc,uint32_t *list)

{
  PCRE2_UCHAR16 PVar1;
  short sVar2;
  uint uVar3;
  uint32_t uVar4;
  uint local_5c;
  bool local_45;
  ushort *puStack_40;
  uint32_t chr;
  PCRE2_SPTR16 end;
  PCRE2_UCHAR16 base;
  PCRE2_UCHAR16 c;
  uint32_t *list_local;
  uint8_t *fcc_local;
  ushort *puStack_18;
  BOOL utf_local;
  PCRE2_SPTR16 code_local;
  
  end._6_2_ = *code;
  *list = (uint)end._6_2_;
  list[1] = 0;
  puStack_18 = code + 1;
  if ((0x20 < end._6_2_) && (end._6_2_ < 0x62)) {
    PVar1 = get_repeat_base(end._6_2_);
    sVar2 = end._6_2_ - (PVar1 - 0x21);
    if ((sVar2 == 0x27) || (((sVar2 == 0x28 || (sVar2 == 0x29)) || (sVar2 == 0x2d)))) {
      puStack_18 = code + 2;
    }
    local_45 = false;
    if (((sVar2 != 0x23) && (local_45 = false, sVar2 != 0x24)) && (local_45 = false, sVar2 != 0x29))
    {
      local_45 = sVar2 != 0x2b;
    }
    list[1] = (uint)local_45;
    if (PVar1 == 0x21) {
      *list = 0x1d;
    }
    else if (PVar1 == 0x2e) {
      *list = 0x1e;
    }
    else if (PVar1 == 0x3b) {
      *list = 0x1f;
    }
    else if (PVar1 == 0x48) {
      *list = 0x20;
    }
    else if (PVar1 == 0x55) {
      *list = (uint)*puStack_18;
      puStack_18 = puStack_18 + 1;
    }
    end._6_2_ = (ushort)*list;
  }
  switch(end._6_2_) {
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
    code_local = puStack_18;
    break;
  default:
    code_local = (PCRE2_SPTR16)0x0;
    break;
  case 0x1d:
  case 0x1f:
    code_local = puStack_18 + 1;
    list[2] = (uint)*puStack_18;
    list[3] = 0xffffffff;
    break;
  case 0x1e:
  case 0x20:
    uVar4 = 0x1f;
    if (end._6_2_ == 0x1e) {
      uVar4 = 0x1d;
    }
    *list = uVar4;
    code_local = puStack_18 + 1;
    uVar3 = (uint)*puStack_18;
    list[2] = uVar3;
    local_5c = uVar3;
    if (uVar3 < 0x100) {
      local_5c = (uint)fcc[uVar3];
    }
    list[3] = local_5c;
    if (uVar3 == list[3]) {
      list[3] = 0xffffffff;
    }
    else {
      list[4] = 0xffffffff;
    }
    break;
  case 0x6e:
  case 0x6f:
  case 0x70:
    if (end._6_2_ == 0x70) {
      puStack_40 = puStack_18 + (long)(int)(uint)*puStack_18 + -1;
    }
    else {
      puStack_40 = puStack_18 + 0x10;
    }
    uVar3 = (uint)*puStack_40;
    if (uVar3 - 0x62 < 2) {
LAB_001422a2:
      list[1] = 1;
      puStack_40 = puStack_40 + 1;
    }
    else {
      if (1 < uVar3 - 100) {
        if (1 < uVar3 - 0x66) {
          if (uVar3 - 0x68 < 2) {
LAB_001422c9:
            list[1] = (uint)(puStack_40[1] == 0);
            puStack_40 = puStack_40 + 3;
            goto LAB_001422ef;
          }
          if (uVar3 != 0x6a) {
            if (uVar3 == 0x6b) goto LAB_001422bb;
            if (uVar3 != 0x6c) {
              if (uVar3 == 0x6d) goto LAB_001422c9;
              goto LAB_001422ef;
            }
          }
        }
        goto LAB_001422a2;
      }
LAB_001422bb:
      puStack_40 = puStack_40 + 1;
    }
LAB_001422ef:
    list[2] = (uint32_t)((long)puStack_40 - (long)puStack_18 >> 1);
    code_local = puStack_40;
  }
  return code_local;
}

Assistant:

static PCRE2_SPTR
get_chr_property_list(PCRE2_SPTR code, BOOL utf, const uint8_t *fcc,
  uint32_t *list)
{
PCRE2_UCHAR c = *code;
PCRE2_UCHAR base;
PCRE2_SPTR end;
uint32_t chr;

#ifdef SUPPORT_UNICODE
uint32_t *clist_dest;
const uint32_t *clist_src;
#else
(void)utf;    /* Suppress "unused parameter" compiler warning */
#endif

list[0] = c;
list[1] = FALSE;
code++;

if (c >= OP_STAR && c <= OP_TYPEPOSUPTO)
  {
  base = get_repeat_base(c);
  c -= (base - OP_STAR);

  if (c == OP_UPTO || c == OP_MINUPTO || c == OP_EXACT || c == OP_POSUPTO)
    code += IMM2_SIZE;

  list[1] = (c != OP_PLUS && c != OP_MINPLUS && c != OP_EXACT &&
             c != OP_POSPLUS);

  switch(base)
    {
    case OP_STAR:
    list[0] = OP_CHAR;
    break;

    case OP_STARI:
    list[0] = OP_CHARI;
    break;

    case OP_NOTSTAR:
    list[0] = OP_NOT;
    break;

    case OP_NOTSTARI:
    list[0] = OP_NOTI;
    break;

    case OP_TYPESTAR:
    list[0] = *code;
    code++;
    break;
    }
  c = list[0];
  }

switch(c)
  {
  case OP_NOT_DIGIT:
  case OP_DIGIT:
  case OP_NOT_WHITESPACE:
  case OP_WHITESPACE:
  case OP_NOT_WORDCHAR:
  case OP_WORDCHAR:
  case OP_ANY:
  case OP_ALLANY:
  case OP_ANYNL:
  case OP_NOT_HSPACE:
  case OP_HSPACE:
  case OP_NOT_VSPACE:
  case OP_VSPACE:
  case OP_EXTUNI:
  case OP_EODN:
  case OP_EOD:
  case OP_DOLL:
  case OP_DOLLM:
  return code;

  case OP_CHAR:
  case OP_NOT:
  GETCHARINCTEST(chr, code);
  list[2] = chr;
  list[3] = NOTACHAR;
  return code;

  case OP_CHARI:
  case OP_NOTI:
  list[0] = (c == OP_CHARI) ? OP_CHAR : OP_NOT;
  GETCHARINCTEST(chr, code);
  list[2] = chr;

#ifdef SUPPORT_UNICODE
  if (chr < 128 || (chr < 256 && !utf))
    list[3] = fcc[chr];
  else
    list[3] = UCD_OTHERCASE(chr);
#elif defined SUPPORT_WIDE_CHARS
  list[3] = (chr < 256) ? fcc[chr] : chr;
#else
  list[3] = fcc[chr];
#endif

  /* The othercase might be the same value. */

  if (chr == list[3])
    list[3] = NOTACHAR;
  else
    list[4] = NOTACHAR;
  return code;

#ifdef SUPPORT_UNICODE
  case OP_PROP:
  case OP_NOTPROP:
  if (code[0] != PT_CLIST)
    {
    list[2] = code[0];
    list[3] = code[1];
    return code + 2;
    }

  /* Convert only if we have enough space. */

  clist_src = PRIV(ucd_caseless_sets) + code[1];
  clist_dest = list + 2;
  code += 2;

  do {
     if (clist_dest >= list + 8)
       {
       /* Early return if there is not enough space. This should never
       happen, since all clists are shorter than 5 character now. */
       list[2] = code[0];
       list[3] = code[1];
       return code;
       }
     *clist_dest++ = *clist_src;
     }
  while(*clist_src++ != NOTACHAR);

  /* All characters are stored. The terminating NOTACHAR is copied from the
  clist itself. */

  list[0] = (c == OP_PROP) ? OP_CHAR : OP_NOT;
  return code;
#endif

  case OP_NCLASS:
  case OP_CLASS:
#ifdef SUPPORT_WIDE_CHARS
  case OP_XCLASS:
  if (c == OP_XCLASS)
    end = code + GET(code, 0) - 1;
  else
#endif
    end = code + 32 / sizeof(PCRE2_UCHAR);

  switch(*end)
    {
    case OP_CRSTAR:
    case OP_CRMINSTAR:
    case OP_CRQUERY:
    case OP_CRMINQUERY:
    case OP_CRPOSSTAR:
    case OP_CRPOSQUERY:
    list[1] = TRUE;
    end++;
    break;

    case OP_CRPLUS:
    case OP_CRMINPLUS:
    case OP_CRPOSPLUS:
    end++;
    break;

    case OP_CRRANGE:
    case OP_CRMINRANGE:
    case OP_CRPOSRANGE:
    list[1] = (GET2(end, 1) == 0);
    end += 1 + 2 * IMM2_SIZE;
    break;
    }
  list[2] = (uint32_t)(end - code);
  return end;
  }
return NULL;    /* Opcode not accepted */
}